

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_a0 [8];
  unique_ptr<LLexer,_std::default_delete<LLexer>_> local_98;
  undefined1 local_90 [8];
  LParser parser;
  allocator<char> local_31;
  string local_30 [8];
  string code;
  
  code.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "if b == (a + c)(b 1 2) then\n   if d == e then       d = 1\n   end\nelse\n   a = 23\nend\nbreak\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::make_unique<LStringLexer,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::unique_ptr<LLexer,std::default_delete<LLexer>>::
  unique_ptr<LStringLexer,std::default_delete<LStringLexer>,void>
            ((unique_ptr<LLexer,std::default_delete<LLexer>> *)&local_98,
             (unique_ptr<LStringLexer,_std::default_delete<LStringLexer>_> *)local_a0);
  LParser::LParser((LParser *)local_90,&local_98);
  std::unique_ptr<LLexer,_std::default_delete<LLexer>_>::~unique_ptr(&local_98);
  std::unique_ptr<LStringLexer,_std::default_delete<LStringLexer>_>::~unique_ptr
            ((unique_ptr<LStringLexer,_std::default_delete<LStringLexer>_> *)local_a0);
  LParser::parse((LParser *)local_90);
  code.field_2._12_4_ = 0;
  LParser::~LParser((LParser *)local_90);
  std::__cxx11::string::~string(local_30);
  return code.field_2._12_4_;
}

Assistant:

int main() {
    std::string code =
            "if b == (a + c)(b 1 2) then\n"
            "   if d == e then"
            "       d = 1\n"
            "   end\n"
            "else\n"
            "   a = 23\n"
            "end\n"
            "break\n";
    auto parser = LParser(std::make_unique<LStringLexer>(code));
    parser.parse();
    return 0;
}